

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O0

void test_given_mode<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,true,gnuplotio::Mode2D>
               (ostream *log_fh,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header,
               undefined8 arg)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string fn_prefix;
  string modename;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *arg_local;
  string *header_local;
  ostream *log_fh_local;
  
  gnuplotio::Mode2D::class_name_abi_cxx11_();
  std::operator+(&local_c8,&basedir_abi_cxx11_,"/");
  std::operator+(&local_a8,&local_c8,header);
  std::operator+(&local_88,&local_a8,"-");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fn_prefix.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  poVar1 = std::operator<<(log_fh,"* ");
  poVar1 = std::operator<<(poVar1,(string *)(fn_prefix.field_2._M_local_buf + 8));
  poVar1 = std::operator<<(poVar1," -> ");
  std::operator+(&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 ".bin");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"record",&local_139);
  gnuplotio::Gnuplot::
  binaryFile<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,gnuplotio::Mode2D>
            (local_f8,&gp,arg,&local_118,local_138);
  poVar1 = std::operator<<(poVar1,local_f8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_118);
  std::operator+(&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 ".txt");
  gnuplotio::Gnuplot::
  file<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,gnuplotio::Mode2D>
            (local_160,&gp,arg,&local_180);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(fn_prefix.field_2._M_local_buf + 8));
  return;
}

Assistant:

void test_given_mode(
    std::ostream &log_fh, std::string header, const T &arg, ArrayMode
) {
    if constexpr (DoBinary) {
        std::string modename = ArrayMode::class_name();
        std::string fn_prefix = basedir+"/"+header+"-"+modename;
        log_fh << "* " << modename << " -> "
            << gp.binaryFile(arg, fn_prefix+".bin", "record", ArrayMode()) << std::endl;
        gp.file(arg, fn_prefix+".txt", ArrayMode());
    } else {
        std::string modename = ArrayMode::class_name();
        std::string fn_prefix = basedir+"/"+header+"-"+modename;
        log_fh << "* " << modename << " (skipped binary) " << std::endl;
        gp.file(arg, fn_prefix+".txt", ArrayMode());
    }
}